

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O0

plutovg_path_command_t
plutovg_path_iterator_next(plutovg_path_iterator_t *it,plutovg_point_t *points)

{
  plutovg_path_element_t *ppVar1;
  plutovg_path_command_t pVar2;
  plutovg_path_element_t *elements;
  plutovg_point_t *points_local;
  plutovg_path_iterator_t *it_local;
  
  ppVar1 = it->elements + it->index;
  pVar2 = (ppVar1->header).command;
  if (PLUTOVG_PATH_COMMAND_LINE_TO < pVar2) {
    if (pVar2 == PLUTOVG_PATH_COMMAND_CUBIC_TO) {
      *points = (plutovg_point_t)ppVar1[1];
      *(plutovg_path_element_t *)(points + 1) = ppVar1[2];
      *(plutovg_path_element_t *)(points + 2) = ppVar1[3];
      goto LAB_0015fce3;
    }
    if (pVar2 != PLUTOVG_PATH_COMMAND_CLOSE) goto LAB_0015fce3;
  }
  *points = (plutovg_point_t)ppVar1[1];
LAB_0015fce3:
  it->index = *(int *)((long)ppVar1 + 4) + it->index;
  return (ppVar1->header).command;
}

Assistant:

plutovg_path_command_t plutovg_path_iterator_next(plutovg_path_iterator_t* it, plutovg_point_t points[3])
{
    const plutovg_path_element_t* elements = it->elements + it->index;
    switch(elements[0].header.command) {
    case PLUTOVG_PATH_COMMAND_MOVE_TO:
    case PLUTOVG_PATH_COMMAND_LINE_TO:
    case PLUTOVG_PATH_COMMAND_CLOSE:
        points[0] = elements[1].point;
        break;
    case PLUTOVG_PATH_COMMAND_CUBIC_TO:
        points[0] = elements[1].point;
        points[1] = elements[2].point;
        points[2] = elements[3].point;
        break;
    }

    it->index += elements[0].header.length;
    return elements[0].header.command;
}